

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

bool __thiscall
msgpack11::NumberValue<(msgpack11::MsgPack::Type)3,_signed_char>::less
          (NumberValue<(msgpack11::MsgPack::Type)3,_signed_char> *this,MsgPackValue *other)

{
  bool bVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  if (iVar2 - 1U < 10) {
    (*(this->super_Value<(msgpack11::MsgPack::Type)3,_signed_char>).super_MsgPackValue.
      _vptr_MsgPackValue[6])(this);
    (*other->_vptr_MsgPackValue[6])(other);
    return extraout_XMM0_Qa < extraout_XMM0_Qa_00;
  }
  bVar1 = Value<(msgpack11::MsgPack::Type)3,_signed_char>::less
                    (&this->super_Value<(msgpack11::MsgPack::Type)3,_signed_char>,other);
  return bVar1;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        switch( other->type() )
        {
            case MsgPack::FLOAT32 : // fall through
            case MsgPack::FLOAT64 : // fall through
            case MsgPack::UINT8   : // fall through
            case MsgPack::UINT16  : // fall through
            case MsgPack::UINT32  : // fall through
            case MsgPack::UINT64  : // fall through
            case MsgPack::INT8    : // fall through
            case MsgPack::INT16   : // fall through
            case MsgPack::INT32   : // fall through
            case MsgPack::INT64   : // fall through
            {
                return float64_value() < other->float64_value();
            } break;
            default               :
            {
                return Value<tag,T>::less( other );
            } break;
        }
    }